

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
LineFiller::score_function
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,LineFiller *this,
          sgNodeID_t n1,sgNodeID_t n2,
          vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *paths)

{
  int iVar1;
  value_type *pvVar2;
  uint uVar3;
  int iVar4;
  vector<long,_std::allocator<long>_> *pvVar5;
  pointer pPVar6;
  pointer plVar7;
  ulong uVar8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var9;
  uint uVar10;
  int iVar11;
  long *rid;
  uint *puVar12;
  pointer pPVar13;
  int iVar14;
  PerfectMatch *match;
  value_type *__x;
  pointer pSVar15;
  uint uVar16;
  uint *puVar17;
  vector<long,_std::allocator<long>_> abs_nodes;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> shared_matches;
  vector<long,_std::allocator<long>_> shared_reads;
  value_type reads_n2;
  value_type reads_n1;
  uint local_e4;
  ulong local_d0;
  _Vector_base<long,_std::allocator<long>_> local_c8;
  vector<long,_std::allocator<long>_> *local_a8;
  pointer local_a0;
  _Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_> local_98;
  _Vector_base<long,_std::allocator<long>_> local_78;
  _Vector_base<long,_std::allocator<long>_> local_60;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  uVar8 = (ulong)(uint)-(int)n1;
  if (0 < (int)n1) {
    uVar8 = n1 & 0xffffffff;
  }
  local_a8 = __return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_48,
             (vector<long,_std::allocator<long>_> *)
             (uVar8 * 0x18 + *(long *)(*(long *)(this + 8) + 0x48)));
  uVar8 = (ulong)(uint)-(int)n2;
  if (0 < (int)n2) {
    uVar8 = n2 & 0xffffffff;
  }
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_60,
             (vector<long,_std::allocator<long>_> *)
             (uVar8 * 0x18 + *(long *)(*(long *)(this + 8) + 0x48)));
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar12 = (uint *)local_48._M_impl.super__Vector_impl_data._M_start;
  puVar17 = (uint *)local_60._M_impl.super__Vector_impl_data._M_start;
  while ((plVar7 = local_78._M_impl.super__Vector_impl_data._M_finish,
         puVar12 != (uint *)local_48._M_impl.super__Vector_impl_data._M_finish &&
         (puVar17 != (uint *)local_60._M_impl.super__Vector_impl_data._M_finish))) {
    uVar16 = *puVar12;
    uVar10 = *puVar17;
    uVar3 = -uVar16;
    if (0 < (int)uVar16) {
      uVar3 = uVar16;
    }
    uVar16 = -uVar10;
    if (0 < (int)uVar10) {
      uVar16 = uVar10;
    }
    if (uVar3 < uVar16) {
      puVar12 = puVar12 + 2;
    }
    else {
      if (uVar3 <= uVar16) {
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)&local_78,(value_type_conflict *)puVar12);
        puVar12 = puVar12 + 2;
      }
      puVar17 = puVar17 + 2;
    }
  }
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (puVar12 = (uint *)local_78._M_impl.super__Vector_impl_data._M_start;
      puVar12 != (uint *)plVar7; puVar12 = puVar12 + 2) {
    uVar16 = *puVar12;
    uVar10 = -uVar16;
    if (0 < (int)uVar16) {
      uVar10 = uVar16;
    }
    pvVar2 = *(value_type **)(*(long *)(*(long *)(this + 8) + 0x18) + 8 + (ulong)uVar10 * 0x18);
    for (__x = *(value_type **)(*(long *)(*(long *)(this + 8) + 0x18) + (ulong)uVar10 * 0x18);
        __x != pvVar2; __x = __x + 1) {
      std::vector<PerfectMatch,_std::allocator<PerfectMatch>_>::push_back
                ((vector<PerfectMatch,_std::allocator<PerfectMatch>_> *)&local_98,__x);
    }
  }
  pSVar15 = (paths->
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (paths->
             super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  iVar14 = 0;
  iVar11 = 0;
  local_e4 = 0;
  for (; pvVar5 = local_a8, pSVar15 != local_a0; pSVar15 = pSVar15 + 1) {
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (long *)0x0;
    puVar17 = (uint *)(pSVar15->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    for (puVar12 = (uint *)(pSVar15->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start;
        pPVar6 = local_98._M_impl.super__Vector_impl_data._M_finish, puVar12 != puVar17;
        puVar12 = puVar12 + 2) {
      uVar16 = *puVar12;
      uVar10 = -uVar16;
      if (0 < (int)uVar16) {
        uVar10 = uVar16;
      }
      local_d0 = (ulong)uVar10;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                ((vector<long,_std::allocator<long>_> *)&local_c8,(long *)&local_d0);
    }
    uVar16 = 0;
    for (pPVar13 = local_98._M_impl.super__Vector_impl_data._M_start; pPVar13 != pPVar6;
        pPVar13 = pPVar13 + 1) {
      iVar1 = (int)pPVar13->node;
      iVar4 = -iVar1;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      local_d0 = CONCAT44(local_d0._4_4_,iVar4);
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (local_c8._M_impl.super__Vector_impl_data._M_start,
                         local_c8._M_impl.super__Vector_impl_data._M_finish,&local_d0);
      uVar10 = 0;
      if (_Var9._M_current != local_c8._M_impl.super__Vector_impl_data._M_finish) {
        uVar10 = (uint)pPVar13->size;
      }
      uVar16 = uVar16 + uVar10;
    }
    if (local_e4 < uVar16) {
      iVar11 = iVar14;
    }
    if ((int)local_e4 < (int)uVar16) {
      local_e4 = uVar16;
    }
    iVar14 = iVar14 + 1;
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_c8);
  }
  std::vector<long,_std::allocator<long>_>::vector
            (local_a8,&(paths->
                       super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar11].nodes);
  std::_Vector_base<PerfectMatch,_std::allocator<PerfectMatch>_>::~_Vector_base(&local_98);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  return pvVar5;
}

Assistant:

std::vector<sgNodeID_t> LineFiller::score_function(sgNodeID_t n1, sgNodeID_t n2, std::vector<SequenceDistanceGraphPath> paths) {

    // Find all reads spanning both nodes

    auto reads_n1 = lrr.node_reads[abs(n1)];
    auto reads_n2 = lrr.node_reads[abs(n2)];
//    std::cout << "Reads in n1: "<< reads_n1.size()<< " reads in n2: "<< reads_n2.size() << std::endl;

    // Get all matches for both ends of the gap
    std::vector<int64_t> shared_reads;
    std::set_intersection(reads_n1.begin(), reads_n1.end(), reads_n2.begin(), reads_n2.end(),  std::back_inserter(shared_reads), [](int64_t r1, int64_t r2){return abs(r1) < abs(r2);});
//    std::cout << "Shared reads: " << shared_reads.size() << std::endl;

    std::vector<PerfectMatch> shared_matches;
    for (const auto& rid: shared_reads){
        for (const auto& match: lrr.read_perfect_matches[abs(rid)]){
            shared_matches.push_back(match);
        }
    }
//    std::cout << "Shared matches: "<< shared_matches.size() << std::endl;

    int32_t max_score = 0;
    int32_t max_score_index = 0;
    int pos = 0;
    for (const auto& path: paths){
        // Absolute node collection for comparison
        int32_t score = 0;
        std::vector<sgNodeID_t> abs_nodes;
        for (const auto& node: path.nodes){
            abs_nodes.push_back(abs(node));
        }

        for (const auto& match: shared_matches){
            if (std::find(abs_nodes.begin(), abs_nodes.end(), abs(match.node)) != abs_nodes.end()){
                score+=match.size;
            }
        }

        if (score>max_score){
            max_score = score;
            max_score_index = pos;
        }

        pos++;
    }
//    std::cout << "Max score: "<< max_score<< " max position: "<< max_score_index << std::endl;
    return paths[max_score_index].nodes;
}